

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void perform_gamma_composition_tests(png_modifier *pm,int do_background,int expand_16)

{
  int iVar1;
  uint local_28;
  uint local_24;
  uint j;
  uint i;
  uint palette_number;
  png_byte bit_depth;
  int iStack_14;
  png_byte colour_type;
  int expand_16_local;
  int do_background_local;
  png_modifier *pm_local;
  
  i._3_1_ = 0;
  i._2_1_ = '\0';
  j = 0;
  palette_number = expand_16;
  iStack_14 = do_background;
  _expand_16_local = pm;
  do {
    do {
      iVar1 = next_format((png_bytep)((long)&i + 3),(png_bytep)((long)&i + 2),&j,
                          *(uint *)&_expand_16_local->field_0x63c >> 0x1e & 1,
                          *(uint *)&_expand_16_local->field_0x63c >> 0xc & 1);
      if (iVar1 == 0) {
        return;
      }
    } while (((i._3_1_ & 4) == 0) && ((i._3_1_ == 3 || (j == 0))));
    for (local_24 = 0; local_24 < _expand_16_local->ngamma_tests; local_24 = local_24 + 1) {
      for (local_28 = 0; local_28 < _expand_16_local->ngamma_tests; local_28 = local_28 + 1) {
        gamma_composition_test
                  (_expand_16_local,i._3_1_,i._2_1_,j,
                   (*(int *)&_expand_16_local->field_0x63c << 0x17) >> 0x17,
                   1.0 / _expand_16_local->gammas[local_24],_expand_16_local->gammas[local_28],
                   *(uint *)&_expand_16_local->field_0x63c >> 0xd & 1,iStack_14,palette_number);
        iVar1 = fail(_expand_16_local);
        if (iVar1 != 0) {
          return;
        }
      }
    }
  } while( true );
}

Assistant:

static void
perform_gamma_composition_tests(png_modifier *pm, int do_background,
   int expand_16)
{
   png_byte colour_type = 0;
   png_byte bit_depth = 0;
   unsigned int palette_number = 0;

   /* Skip the non-alpha cases - there is no setting of a transparency colour at
    * present.
    *
    * TODO: incorrect; the palette case sets tRNS and, now RGB and gray do,
    * however the palette case fails miserably so is commented out below.
    */
   while (next_format(&colour_type, &bit_depth, &palette_number,
                      pm->test_lbg_gamma_composition, pm->test_tRNS))
      if ((colour_type & PNG_COLOR_MASK_ALPHA) != 0
#if 0 /* TODO: FIXME */
          /*TODO: FIXME: this should work */
          || colour_type == 3
#endif
          || (colour_type != 3 && palette_number != 0))
   {
      unsigned int i, j;

      /* Don't skip the i==j case here - it's relevant. */
      for (i=0; i<pm->ngamma_tests; ++i)
      {
         for (j=0; j<pm->ngamma_tests; ++j)
         {
            gamma_composition_test(pm, colour_type, bit_depth, palette_number,
               pm->interlace_type, 1/pm->gammas[i], pm->gammas[j],
               pm->use_input_precision, do_background, expand_16);

            if (fail(pm))
               return;
         }
      }
   }
}